

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5IndexMerge(Fts5Index *p,Fts5Structure **ppStruct,int nPg,int nMin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int iLvl;
  ulong uVar7;
  Fts5Structure *pStruct;
  int nRem;
  Fts5Structure **local_38;
  
  pStruct = *ppStruct;
  iVar2 = 0;
  nRem = nPg;
  local_38 = ppStruct;
  while ((0 < nRem && (p->rc == 0))) {
    uVar4 = 0;
    uVar5 = (ulong)(uint)pStruct->nLevel;
    if (pStruct->nLevel < 1) {
      uVar5 = uVar4;
    }
    piVar6 = &pStruct->aLevel[0].nSeg;
    uVar7 = 0;
    iVar3 = 0;
    for (; iLvl = (int)uVar7, uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar1 = ((Fts5StructureLevel *)(piVar6 + -1))->nMerge;
      if (iVar1 != 0) {
        if (iVar3 < iVar1) {
          iLvl = (int)uVar4;
          iVar3 = iVar1;
        }
        break;
      }
      if (iVar3 < *piVar6) {
        uVar7 = uVar4 & 0xffffffff;
        iVar3 = *piVar6;
      }
      piVar6 = piVar6 + 4;
    }
    if ((iVar3 < nMin) && (pStruct->aLevel[iLvl].nMerge == 0)) break;
    fts5IndexMergeLevel(p,&pStruct,iLvl,&nRem);
    if ((p->rc == 0) && (pStruct->aLevel[iLvl].nMerge == 0)) {
      fts5StructurePromote(p,iLvl + 1,pStruct);
    }
    iVar2 = 1;
  }
  *local_38 = pStruct;
  return iVar2;
}

Assistant:

static int fts5IndexMerge(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Current structure of index */
  int nPg,                        /* Pages of work to do */
  int nMin                        /* Minimum number of segments to merge */
){
  int nRem = nPg;
  int bRet = 0;
  Fts5Structure *pStruct = *ppStruct;
  while( nRem>0 && p->rc==SQLITE_OK ){
    int iLvl;                   /* To iterate through levels */
    int iBestLvl = 0;           /* Level offering the most input segments */
    int nBest = 0;              /* Number of input segments on best level */

    /* Set iBestLvl to the level to read input segments from. */
    assert( pStruct->nLevel>0 );
    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      if( pLvl->nMerge ){
        if( pLvl->nMerge>nBest ){
          iBestLvl = iLvl;
          nBest = pLvl->nMerge;
        }
        break;
      }
      if( pLvl->nSeg>nBest ){
        nBest = pLvl->nSeg;
        iBestLvl = iLvl;
      }
    }

    /* If nBest is still 0, then the index must be empty. */
#ifdef SQLITE_DEBUG
    for(iLvl=0; nBest==0 && iLvl<pStruct->nLevel; iLvl++){
      assert( pStruct->aLevel[iLvl].nSeg==0 );
    }
#endif

    if( nBest<nMin && pStruct->aLevel[iBestLvl].nMerge==0 ){
      break;
    }
    bRet = 1;
    fts5IndexMergeLevel(p, &pStruct, iBestLvl, &nRem);
    if( p->rc==SQLITE_OK && pStruct->aLevel[iBestLvl].nMerge==0 ){
      fts5StructurePromote(p, iBestLvl+1, pStruct);
    }
  }
  *ppStruct = pStruct;
  return bRet;
}